

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O2

bool __thiscall re2::Backtracker::Try(Backtracker *this,int id,char *p)

{
  Inst *this_00;
  uint uVar1;
  char *pcVar2;
  StringPiece *pSVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  EmptyOp EVar7;
  uint32 uVar8;
  ostream *this_01;
  ulong uVar9;
  ulong uVar10;
  uint c;
  LogMessageFatal LStack_1a8;
  
  if (p < (this->text_).ptr_ + (this->text_).length_) {
    c = (uint)(byte)*p;
  }
  else {
    c = 0xffffffff;
  }
  this_00 = this->prog_->inst_ + id;
  uVar1 = this_00->out_opcode_;
  switch(uVar1 & 7) {
  case 0:
    LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0xba);
    this_01 = std::operator<<((ostream *)&LStack_1a8.super_LogMessage.str_,"Unexpected opcode: ");
    std::ostream::operator<<(this_01,this_00->out_opcode_ & 7);
    LogMessageFatal::~LogMessageFatal(&LStack_1a8);
    break;
  case 2:
    bVar5 = Prog::Inst::Matches(this_00,c);
    if (bVar5) {
      uVar1 = this_00->out_opcode_;
      p = p + 1;
      goto LAB_00126f11;
    }
    break;
  case 3:
    iVar6 = Prog::Inst::cap(this_00);
    if ((-1 < iVar6) && (iVar6 = Prog::Inst::cap(this_00), iVar6 < 0x40)) {
      iVar6 = Prog::Inst::cap(this_00);
      pcVar2 = this->cap_[iVar6];
      iVar6 = Prog::Inst::cap(this_00);
      this->cap_[iVar6] = p;
      bVar5 = Visit(this,this_00->out_opcode_ >> 4,p);
      iVar6 = Prog::Inst::cap(this_00);
      this->cap_[iVar6] = pcVar2;
      return bVar5;
    }
    goto LAB_00126f08;
  case 4:
    EVar7 = Prog::Inst::empty(this_00);
    uVar8 = Prog::EmptyFlags(&this->context_,p);
    if ((EVar7 & ~uVar8) != 0) {
      return false;
    }
LAB_00126f08:
    uVar1 = this_00->out_opcode_;
LAB_00126f11:
    bVar5 = Visit(this,uVar1 >> 4,p);
    return bVar5;
  case 5:
    if ((this->endmatch_ != true) || ((this->context_).ptr_ + (this->context_).length_ == p)) {
      this->cap_[1] = p;
      pSVar3 = this->submatch_;
      if (pSVar3->ptr_ != (char *)0x0) {
        if (this->longest_ != true) {
          return true;
        }
        if (p <= pSVar3->ptr_ + pSVar3->length_) {
          return true;
        }
      }
      uVar10 = 0;
      uVar9 = (ulong)(uint)this->nsubmatch_;
      if (this->nsubmatch_ < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
        uVar4 = *(undefined8 *)((long)this->cap_ + uVar10);
        iVar6 = *(int *)((long)this->cap_ + uVar10 + 8);
        *(undefined8 *)((long)&pSVar3->ptr_ + uVar10) = uVar4;
        *(int *)((long)&pSVar3->length_ + uVar10) = iVar6 - (int)uVar4;
      }
      return true;
    }
    break;
  case 6:
    goto LAB_00126f11;
  }
  return false;
}

Assistant:

bool Backtracker::Try(int id, const char* p) {
  // Pick out byte at current position.  If at end of string,
  // have to explore in hope of finishing a match.  Use impossible byte -1.
  int c = -1;
  if (p < text_.end())
    c = *p & 0xFF;

  Prog::Inst* ip = prog_->inst(id);
  switch (ip->opcode()) {
    default:
      LOG(FATAL) << "Unexpected opcode: " << (int)ip->opcode();
      return false;  // not reached

    case kInstAltMatch:
      // Ignored.
      return false;

    case kInstByteRange:
      if (ip->Matches(c))
        return Visit(ip->out(), p+1);
      return false;

    case kInstCapture:
      if (0 <= ip->cap() && ip->cap() < arraysize(cap_)) {
        // Capture p to register, but save old value.
        const char* q = cap_[ip->cap()];
        cap_[ip->cap()] = p;
        bool ret = Visit(ip->out(), p);
        // Restore old value as we backtrack.
        cap_[ip->cap()] = q;
        return ret;
      }
      return Visit(ip->out(), p);

    case kInstEmptyWidth:
      if (ip->empty() & ~Prog::EmptyFlags(context_, p))
        return false;
      return Visit(ip->out(), p);

    case kInstNop:
      return Visit(ip->out(), p);

    case kInstMatch:
      // We found a match.  If it's the best so far, record the
      // parameters in the caller's submatch_ array.
      if (endmatch_ && p != context_.end())
        return false;
      cap_[1] = p;
      if (submatch_[0].data() == NULL ||           // First match so far ...
          (longest_ && p > submatch_[0].end())) {  // ... or better match
        for (int i = 0; i < nsubmatch_; i++)
          submatch_[i].set(cap_[2*i],
                           static_cast<int>(cap_[2*i+1] - cap_[2*i]));
      }
      return true;

    case kInstFail:
      return false;
  }
}